

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O2

_Bool create_GL_context(SWindowData *window_data)

{
  byte *pbVar1;
  SWindowData_X11 *window_data_x11;
  _Bool _Var2;
  long lVar3;
  byte *__haystack;
  byte *pbVar4;
  GLint minorGLX;
  GLint majorGLX;
  
  window_data_x11 = (SWindowData_X11 *)window_data->specific;
  glXQueryVersion(window_data_x11->display,&majorGLX);
  if (majorGLX < 2) {
    fwrite("GLX 1.2 or greater is required.\n",0x20,1,_stderr);
    XCloseDisplay(window_data_x11->display);
    return false;
  }
  _Var2 = setup_pixel_format(window_data_x11);
  if (!_Var2) {
    return false;
  }
  glXMakeCurrent(window_data_x11->display,window_data_x11->window,window_data_x11->context);
  init_GL(window_data);
  __haystack = CheckGLExtension_extensions;
  if (CheckGLExtension_extensions == (byte *)0x0) {
    lVar3 = glXGetCurrentDisplay();
    __haystack = (byte *)glXQueryExtensionsString(lVar3,*(undefined4 *)(lVar3 + 0xe0));
    CheckGLExtension_extensions = __haystack;
    if (__haystack == (byte *)0x0) goto LAB_001043a0;
  }
  do {
    pbVar4 = (byte *)strstr((char *)__haystack,"GLX_EXT_swap_control");
    if (pbVar4 == (byte *)0x0) {
      return true;
    }
    pbVar1 = pbVar4 + 0x14;
  } while (((pbVar4 != __haystack) && (__haystack = pbVar1, pbVar4[-1] != 0x20)) ||
          (__haystack = pbVar1, (*pbVar1 & 0xdf) != 0));
LAB_001043a0:
  SwapIntervalEXT = (PFNGLXSWAPINTERVALEXTPROC)glXGetProcAddress("glXSwapIntervalEXT");
  set_target_fps_aux();
  return true;
}

Assistant:

bool
create_GL_context(SWindowData *window_data) {
#if defined(_WIN32) || defined(WIN32)
    SWindowData_Win *window_data_win = (SWindowData_Win *) window_data->specific;

    if (setup_pixel_format(window_data_win->hdc) == false)
        return false;

    window_data_win->hGLRC = wglCreateContext(window_data_win->hdc);
    wglMakeCurrent(window_data_win->hdc, window_data_win->hGLRC);
    init_GL(window_data);

    SwapIntervalEXT    = (PFNWGLSWAPINTERVALEXTPROC)    wglGetProcAddress("wglSwapIntervalEXT");
    GetSwapIntervalEXT = (PFNWGLGETSWAPINTERVALEXTPROC) wglGetProcAddress("wglGetSwapIntervalEXT");
    set_target_fps_aux();

    return true;

#elif defined(linux)
    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;

    GLint majorGLX, minorGLX = 0;
    glXQueryVersion(window_data_x11->display, &majorGLX, &minorGLX);
    if (majorGLX <= 1 && minorGLX < 2) {
        fprintf(stderr, "GLX 1.2 or greater is required.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }
    else {
        //fprintf(stdout, "GLX version: %d.%d\n", majorGLX, minorGLX);
    }

    if (setup_pixel_format(window_data_x11) == false)
        return false;

    glXMakeCurrent(window_data_x11->display, window_data_x11->window, window_data_x11->context);

    //fprintf(stdout, "GL Vendor: %s\n", glGetString(GL_VENDOR));
    //fprintf(stdout, "GL Renderer: %s\n", glGetString(GL_RENDERER));
    //fprintf(stdout, "GL Version: %s\n", glGetString(GL_VERSION));
    //fprintf(stdout, "GL Shading Language: %s\n", glGetString(GL_SHADING_LANGUAGE_VERSION));

    init_GL(window_data);

    if (CheckGLExtension("GLX_EXT_swap_control")) {
        SwapIntervalEXT = (PFNGLXSWAPINTERVALEXTPROC) glXGetProcAddress((const GLubyte *)"glXSwapIntervalEXT");
        set_target_fps_aux();
    }

    return true;
#endif
}